

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O0

void srunner_iterate_suites
               (SRunner *sr,char *sname,char *tcname,char *include_tags,char *exclude_tags,
               print_output print_mode)

{
  List *lp;
  List *lp_00;
  int iVar1;
  uint uVar2;
  List *check_for;
  List *check_for_00;
  Suite *s_00;
  TCase *tc_00;
  Suite *s;
  TCase *tc;
  List *tcl;
  List *slst;
  List *exclude_tag_lst;
  List *include_tag_lst;
  print_output print_mode_local;
  char *exclude_tags_local;
  char *include_tags_local;
  char *tcname_local;
  char *sname_local;
  SRunner *sr_local;
  
  lp = sr->slst;
  check_for = tag_string_to_list(include_tags);
  check_for_00 = tag_string_to_list(exclude_tags);
  check_list_front(lp);
  while (iVar1 = check_list_at_end(lp), iVar1 == 0) {
    s_00 = (Suite *)check_list_val(lp);
    if (((sname == (char *)0x0) || (iVar1 = strcmp(sname,s_00->name), iVar1 == 0)) &&
       ((tcname == (char *)0x0 || (iVar1 = suite_tcase(s_00,tcname), iVar1 != 0)))) {
      log_suite_start(sr,s_00);
      lp_00 = s_00->tclst;
      check_list_front(lp_00);
      while (iVar1 = check_list_at_end(lp_00), iVar1 == 0) {
        tc_00 = (TCase *)check_list_val(lp_00);
        if (((tcname == (char *)0x0) || (iVar1 = strcmp(tcname,tc_00->name), iVar1 == 0)) &&
           (((include_tags == (char *)0x0 ||
             (uVar2 = tcase_matching_tag(tc_00,check_for), uVar2 != 0)) &&
            ((exclude_tags == (char *)0x0 ||
             (uVar2 = tcase_matching_tag(tc_00,check_for_00), uVar2 == 0)))))) {
          srunner_run_tcase(sr,tc_00);
        }
        check_list_advance(lp_00);
      }
      log_suite_end(sr,s_00);
    }
    check_list_advance(lp);
  }
  check_list_apply(check_for,free);
  check_list_apply(check_for_00,free);
  check_list_free(check_for);
  check_list_free(check_for_00);
  return;
}

Assistant:

static void srunner_iterate_suites(SRunner * sr,
                                   const char *sname, const char *tcname,
                                   const char *include_tags,
                                   const char *exclude_tags,
                                   enum print_output CK_ATTRIBUTE_UNUSED
                                   print_mode)
{
    List *include_tag_lst;
    List *exclude_tag_lst;
    List *slst;
    List *tcl;
    TCase *tc;

    slst = sr->slst;

    include_tag_lst = tag_string_to_list(include_tags);
    exclude_tag_lst = tag_string_to_list(exclude_tags);

    for(check_list_front(slst); !check_list_at_end(slst);
        check_list_advance(slst))
    {
        Suite *s = (Suite *)check_list_val(slst);

        if(((sname != NULL) && (strcmp(sname, s->name) != 0))
           || ((tcname != NULL) && (!suite_tcase(s, tcname))))
            continue;

        log_suite_start(sr, s);

        tcl = s->tclst;

        for(check_list_front(tcl); !check_list_at_end(tcl);
            check_list_advance(tcl))
        {
            tc = (TCase *)check_list_val(tcl);

            if((tcname != NULL) && (strcmp(tcname, tc->name) != 0))
            {
                continue;
            }
            if (include_tags != NULL)
            {
                if (!tcase_matching_tag(tc, include_tag_lst))
                {
                    continue;
                }
            }
            if (exclude_tags != NULL)
            {
                if (tcase_matching_tag(tc, exclude_tag_lst))
                {
                    continue;
                }
            }

            srunner_run_tcase(sr, tc);
        }

        log_suite_end(sr, s);
    }

    check_list_apply(include_tag_lst, free);
    check_list_apply(exclude_tag_lst, free);
    check_list_free(include_tag_lst);
    check_list_free(exclude_tag_lst);
}